

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

Gia_Man_t * Gia_ManDupCofInt(Gia_Man_t *p,int iVar)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint local_40;
  int local_3c;
  int iCofVar;
  int i;
  Gia_Obj_t *pPivot;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int iVar_local;
  Gia_Man_t *p_local;
  
  local_40 = 0xffffffff;
  if ((iVar < 1) || (iVar1 = Gia_ManObjNum(p), iVar1 <= iVar)) {
    uVar2 = Gia_ManObjNum(p);
    printf("Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n",(ulong)(uint)iVar,0,
           (ulong)uVar2);
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    pObj_00 = Gia_ManObj(p,iVar);
    iVar1 = Gia_ObjIsCand(pObj_00);
    if (iVar1 == 0) {
      printf("Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n",(ulong)(uint)iVar);
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      iVar1 = Gia_ManObjNum(p);
      p_local = Gia_ManStart(iVar1);
      pcVar5 = Abc_UtilStrsav(p->pName);
      p_local->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      p_local->pSpec = pcVar5;
      Gia_ManHashAlloc(p_local);
      Gia_ManFillValue(p);
      pGVar6 = Gia_ManConst0(p);
      pGVar6->Value = 0;
      local_3c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if (local_3c < iVar1) {
          pPivot = Gia_ManCi(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ManAppendCi(p_local);
        pPivot->Value = uVar2;
        if (pPivot == pObj_00) {
          local_40 = pPivot->Value;
          uVar2 = Abc_Var2Lit(0,0);
          pPivot->Value = uVar2;
        }
        local_3c = local_3c + 1;
      }
      local_3c = 0;
      while( true ) {
        bVar7 = false;
        if (local_3c < p->nObjs) {
          pPivot = Gia_ManObj(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(pPivot);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy(pPivot);
          iVar3 = Gia_ObjFanin1Copy(pPivot);
          uVar2 = Gia_ManHashAnd(p_local,iVar1,iVar3);
          pPivot->Value = uVar2;
          if (pPivot == pObj_00) {
            local_40 = pPivot->Value;
            uVar2 = Abc_Var2Lit(0,0);
            pPivot->Value = uVar2;
          }
        }
        local_3c = local_3c + 1;
      }
      local_3c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if (local_3c < iVar1) {
          pPivot = Gia_ManCo(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ObjFanin0Copy(pPivot);
        pPivot->Value = uVar2;
        local_3c = local_3c + 1;
      }
      local_3c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if (local_3c < iVar1) {
          pPivot = Gia_ManCi(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        pGVar6 = Gia_ManCi(p_local,local_3c);
        iVar1 = Gia_ObjId(p_local,pGVar6);
        uVar2 = Abc_Var2Lit(iVar1,0);
        pPivot->Value = uVar2;
        if (pPivot == pObj_00) {
          uVar2 = Abc_Var2Lit(0,1);
          pPivot->Value = uVar2;
        }
        local_3c = local_3c + 1;
      }
      local_3c = 0;
      while( true ) {
        bVar7 = false;
        if (local_3c < p->nObjs) {
          pPivot = Gia_ManObj(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(pPivot);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy(pPivot);
          iVar3 = Gia_ObjFanin1Copy(pPivot);
          uVar2 = Gia_ManHashAnd(p_local,iVar1,iVar3);
          pPivot->Value = uVar2;
          if (pPivot == pObj_00) {
            uVar2 = Abc_Var2Lit(0,1);
            pPivot->Value = uVar2;
          }
        }
        local_3c = local_3c + 1;
      }
      if ((int)local_40 < 1) {
        __assert_fail("iCofVar > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                      ,0x346,"Gia_Man_t *Gia_ManDupCofInt(Gia_Man_t *, int)");
      }
      local_3c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if (local_3c < iVar1) {
          pPivot = Gia_ManCo(p,local_3c);
          bVar7 = pPivot != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = pPivot->Value;
        uVar4 = Gia_ObjFanin0Copy(pPivot);
        if (uVar2 == uVar4) {
          iVar1 = Gia_ObjFanin0Copy(pPivot);
          uVar2 = Gia_ManAppendCo(p_local,iVar1);
          pPivot->Value = uVar2;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(pPivot);
          iVar1 = Gia_ManHashMux(p_local,local_40,iVar1,pPivot->Value);
          uVar2 = Gia_ManAppendCo(p_local,iVar1);
          pPivot->Value = uVar2;
        }
        local_3c = local_3c + 1;
      }
      Gia_ManHashStop(p_local);
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_local,iVar1);
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDupCofInt( Gia_Man_t * p, int iVar )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pPivot;
    int i, iCofVar = -1;
    if ( !(iVar > 0 && iVar < Gia_ManObjNum(p)) )
    {
        printf( "Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n", iVar, 0, Gia_ManObjNum(p) );
        return NULL;
    }
    // find the cofactoring variable
    pPivot = Gia_ManObj( p, iVar );
    if ( !Gia_ObjIsCand(pPivot) )
    {
        printf( "Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n", iVar );
        return NULL;
    }
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // compute negative cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // compute the positive cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Abc_Var2Lit( Gia_ObjId(pNew, Gia_ManCi(pNew, i)), 0 );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    // create MUXes
    assert( iCofVar > 0 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( pObj->Value == (unsigned)Gia_ObjFanin0Copy(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ManHashMux(pNew, iCofVar, Gia_ObjFanin0Copy(pObj), pObj->Value) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}